

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsVersion.cpp
# Opt level: O1

string * os_info_abi_cxx11_(void)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  utsname details;
  utsname local_19e;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  memset(&local_19e,0,0x186);
  iVar1 = uname(&local_19e);
  if (iVar1 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_RDI,local_19e.sysname);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,' ');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,' ');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_RDI,local_19e.release);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,' ');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,' ');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_RDI,local_19e.version);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (in_RDI,0,in_RDI->_M_string_length,"POSIX",5);
  }
  return (string *)in_RDI;
}

Assistant:

std::string os_info()
{
    std::string osInfo;
    utsname details = {};

    const int ret = uname(&details);

    if (ret == 0) {
        osInfo.append(details.sysname);
        osInfo.push_back(' ');
        osInfo.push_back(' ');
        osInfo.append(details.release);
        osInfo.push_back(' ');
        osInfo.push_back(' ');
        osInfo.append(details.version);
    } else {
        osInfo = "POSIX";
    }
    return osInfo;
}